

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig *self,int new_size,ImFontConfig v)

{
  int iVar1;
  ImFontConfig *__dest;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar2 <= new_size) {
      iVar2 = new_size;
    }
    if (iVar1 < iVar2) {
      __dest = (ImFontConfig *)ImGui::MemAlloc((long)iVar2 * 0x88);
      if (self->Data != (ImFontConfig *)0x0) {
        memcpy(__dest,self->Data,(long)self->Size * 0x88);
        ImGui::MemFree(self->Data);
      }
      self->Data = __dest;
      self->Capacity = iVar2;
    }
  }
  iVar1 = self->Size;
  if (iVar1 < new_size) {
    lVar3 = (long)new_size - (long)iVar1;
    lVar4 = (long)iVar1 * 0x88;
    do {
      memcpy(self->Data->Name + lVar4 + -0x54,&v,0x88);
      lVar4 = lVar4 + 0x88;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig* self,int new_size,const ImFontConfig v)
{
    return self->resize(new_size,v);
}